

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_multiple_bindings_initializer_list.cpp
# Opt level: O2

int main(void)

{
  uint __line;
  char *__assertion;
  vector<int,_std::allocator<int>_> v;
  int local_2c [3];
  i injector;
  
  injector.super_injector_t.
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::core::array<int>,_std::initializer_list<int>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
  .
  super_dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::core::array<int>,_std::initializer_list<int>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  .super_scope<boost::ext::di::v1_3_0::core::array<int>,_std::initializer_list<int>,_int>.object_.
  _M_array = local_2c;
  local_2c[0] = 1;
  local_2c[1] = 2;
  local_2c[2] = 3;
  injector.super_injector_t.
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::core::array<int>,_std::initializer_list<int>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
  .
  super_dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::core::array<int>,_std::initializer_list<int>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  .super_scope<boost::ext::di::v1_3_0::core::array<int>,_std::initializer_list<int>,_int>.object_.
  _M_len = 3;
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::core::array<int>,_std::initializer_list<int>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  ::create<std::vector<int,_std::allocator<int>_>,_0>(&v,&injector.super_injector_t);
  if ((long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      == 0xc) {
    if (*v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start ==
        1) {
      if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [1] == 2) {
        if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [2] == 3) {
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&v.super__Vector_base<int,_std::allocator<int>_>);
          return 0;
        }
        __assertion = "3 == v[2]";
        __line = 0x2b;
      }
      else {
        __assertion = "2 == v[1]";
        __line = 0x2a;
      }
    }
    else {
      __assertion = "1 == v[0]";
      __line = 0x29;
    }
  }
  else {
    __assertion = "3 == v.size()";
    __line = 0x28;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/bind_multiple_bindings_initializer_list.cpp"
                ,__line,"int main()");
}

Assistant:

int main() {
  // clang-format off
  auto il = {1, 2, 3};
  auto injector = di::make_injector(
    di::bind<int[]>().to(il) // or di::bind<int*[]>.to(il)
  );
  // clang-format on

  auto v = injector.create<std::vector<int>>();
  assert(3 == v.size());
  assert(1 == v[0]);
  assert(2 == v[1]);
  assert(3 == v[2]);
}